

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::vector<google::protobuf::TextFormat::ParseLocationRange,std::allocator<google::protobuf::TextFormat::ParseLocationRange>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<google::protobuf::TextFormat::ParseLocationRange,std::allocator<google::protobuf::TextFormat::ParseLocationRange>>>>>
::find_non_soo<google::protobuf::FieldDescriptor_const*>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::vector<google::protobuf::TextFormat::ParseLocationRange,std::allocator<google::protobuf::TextFormat::ParseLocationRange>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<google::protobuf::TextFormat::ParseLocationRange,std::allocator<google::protobuf::TextFormat::ParseLocationRange>>>>>
           *this,key_arg<const_google::protobuf::FieldDescriptor_*> *key,size_t hash)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  key_arg<const_google::protobuf::FieldDescriptor_*> pFVar4;
  uint uVar5;
  char cVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  ushort uVar10;
  ulong uVar11;
  ctrl_t *pcVar12;
  long lVar13;
  anon_union_8_1_a8a14541_for_iterator_2 unaff_R15;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  __m128i match;
  iterator iVar22;
  ulong local_50;
  char cVar17;
  char cVar19;
  char cVar20;
  char cVar21;
  
  uVar2 = *(ulong *)this;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar3 = *(ulong *)(this + 0x10);
  uVar9 = (hash >> 7 ^ uVar3 >> 0xc) & uVar2;
  bVar7 = (byte)hash;
  pcVar12 = (ctrl_t *)(ulong)(bVar7 & 0x7f);
  auVar15 = ZEXT216(CONCAT11(bVar7,bVar7) & 0x7f7f);
  auVar15 = pshuflw(auVar15,auVar15,0);
  local_50 = 0;
  do {
    pcVar1 = (char *)(uVar3 + uVar9);
    cVar6 = pcVar1[0xf];
    cVar17 = auVar15[0];
    auVar18[0] = -(cVar17 == *pcVar1);
    cVar19 = auVar15[1];
    auVar18[1] = -(cVar19 == pcVar1[1]);
    cVar20 = auVar15[2];
    auVar18[2] = -(cVar20 == pcVar1[2]);
    cVar21 = auVar15[3];
    auVar18[3] = -(cVar21 == pcVar1[3]);
    auVar18[4] = -(cVar17 == pcVar1[4]);
    auVar18[5] = -(cVar19 == pcVar1[5]);
    auVar18[6] = -(cVar20 == pcVar1[6]);
    auVar18[7] = -(cVar21 == pcVar1[7]);
    auVar18[8] = -(cVar17 == pcVar1[8]);
    auVar18[9] = -(cVar19 == pcVar1[9]);
    auVar18[10] = -(cVar20 == pcVar1[10]);
    auVar18[0xb] = -(cVar21 == pcVar1[0xb]);
    auVar18[0xc] = -(cVar17 == pcVar1[0xc]);
    auVar18[0xd] = -(cVar19 == pcVar1[0xd]);
    auVar18[0xe] = -(cVar20 == pcVar1[0xe]);
    auVar18[0xf] = -(cVar21 == cVar6);
    uVar10 = (ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe | (ushort)(auVar18[0xf] >> 7) << 0xf;
    uVar8 = (uint)uVar10;
    bVar14 = uVar10 == 0;
    if (!bVar14) {
      do {
        uVar5 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        uVar11 = uVar5 + uVar9 & uVar2;
        lVar13 = uVar11 * 0x20;
        pFVar4 = *(key_arg<const_google::protobuf::FieldDescriptor_*> *)
                  (*(long *)(this + 0x18) + lVar13);
        if (pFVar4 == *key) {
          if (*(long *)(this + 0x10) == 0) {
            __assert_fail("ctrl != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x9ef,
                          "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FieldDescriptor *, std::vector<google::protobuf::TextFormat::ParseLocationRange>>, absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FieldDescriptor *const, std::vector<google::protobuf::TextFormat::ParseLocationRange>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FieldDescriptor *, std::vector<google::protobuf::TextFormat::ParseLocationRange>>, Hash = absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FieldDescriptor *const, std::vector<google::protobuf::TextFormat::ParseLocationRange>>>]"
                         );
          }
          unaff_R15.slot_ = (slot_type *)(lVar13 + *(long *)(this + 0x18));
          pcVar12 = (ctrl_t *)(uVar11 + *(long *)(this + 0x10));
        }
        if (pFVar4 == *key) break;
        uVar10 = (ushort)(uVar8 - 1) & (ushort)uVar8;
        uVar8 = CONCAT22((short)(uVar8 - 1 >> 0x10),uVar10);
        bVar14 = uVar10 == 0;
      } while (!bVar14);
    }
    if (bVar14) {
      auVar16[0] = -(*pcVar1 == -0x80);
      auVar16[1] = -(pcVar1[1] == -0x80);
      auVar16[2] = -(pcVar1[2] == -0x80);
      auVar16[3] = -(pcVar1[3] == -0x80);
      auVar16[4] = -(pcVar1[4] == -0x80);
      auVar16[5] = -(pcVar1[5] == -0x80);
      auVar16[6] = -(pcVar1[6] == -0x80);
      auVar16[7] = -(pcVar1[7] == -0x80);
      auVar16[8] = -(pcVar1[8] == -0x80);
      auVar16[9] = -(pcVar1[9] == -0x80);
      auVar16[10] = -(pcVar1[10] == -0x80);
      auVar16[0xb] = -(pcVar1[0xb] == -0x80);
      auVar16[0xc] = -(pcVar1[0xc] == -0x80);
      auVar16[0xd] = -(pcVar1[0xd] == -0x80);
      auVar16[0xe] = -(pcVar1[0xe] == -0x80);
      auVar16[0xf] = -(cVar6 == -0x80);
      if ((((((((((((((((auVar16 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar16 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar16 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar16 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar16 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar16 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar16 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar16 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar16 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar16 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar16 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar16 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar16 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar16 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar16 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar6 == -0x80) {
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>_>_>
        ::AssertNotDebugCapacity
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>_>_>
                    *)this);
        pcVar12 = (ctrl_t *)0x0;
        goto LAB_00313c8a;
      }
      if (*(ulong *)this < local_50 + 0x10) {
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe37,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FieldDescriptor *, std::vector<google::protobuf::TextFormat::ParseLocationRange>>, absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FieldDescriptor *const, std::vector<google::protobuf::TextFormat::ParseLocationRange>>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FieldDescriptor *, std::vector<google::protobuf::TextFormat::ParseLocationRange>>, Hash = absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FieldDescriptor *const, std::vector<google::protobuf::TextFormat::ParseLocationRange>>>, K = const google::protobuf::FieldDescriptor *]"
                     );
      }
      uVar9 = uVar9 + local_50 + 0x10 & uVar2;
      bVar14 = true;
      local_50 = local_50 + 0x10;
    }
    else {
LAB_00313c8a:
      bVar14 = false;
    }
    if (!bVar14) {
      iVar22.field_1 =
           (anon_union_8_1_a8a14541_for_iterator_2)
           (anon_union_8_1_a8a14541_for_iterator_2)unaff_R15.slot_;
      iVar22.ctrl_ = pcVar12;
      return iVar22;
    }
  } while( true );
}

Assistant:

size_t capacity() const { return capacity_; }